

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

void FunctionDef::accessToJson(QJsonObject *obj,Access acs)

{
  qsizetype qVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView key;
  QJsonValueConstRef local_40;
  QJsonValue local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (acs == Public) {
    pcVar2 = "public";
    qVar1 = 6;
  }
  else if (acs == Protected) {
    pcVar2 = "protected";
    qVar1 = 9;
  }
  else {
    if (acs != Private) goto LAB_0012ee9b;
    pcVar2 = "private";
    qVar1 = 7;
  }
  s.m_size = qVar1;
  s.m_data = pcVar2;
  QJsonValue::QJsonValue(&local_30,s);
  key.m_size = 6;
  key.m_data = "access";
  local_40 = (QJsonValueConstRef)QJsonObject::operator[](obj,key);
  QJsonValueRef::operator=((QJsonValueRef *)&local_40,&local_30);
  QJsonValue::~QJsonValue(&local_30);
LAB_0012ee9b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FunctionDef::accessToJson(QJsonObject *obj, FunctionDef::Access acs)
{
    switch (acs) {
    case Private: (*obj)["access"_L1] = "private"_L1; break;
    case Public: (*obj)["access"_L1] = "public"_L1; break;
    case Protected: (*obj)["access"_L1] = "protected"_L1; break;
    }
}